

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::DeepScanLineInputFile::initialize(DeepScanLineInputFile *this,Header *header)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  Format FVar5;
  int iVar6;
  string *__lhs;
  int *piVar7;
  LineOrder *pLVar8;
  Box2i *pBVar9;
  Compression *pCVar10;
  Compressor *pCVar11;
  LineBuffer *pLVar12;
  long lVar13;
  ChannelList *this_00;
  const_iterator cVar14;
  ConstIterator CVar15;
  ostream *poVar16;
  ArgExc *pAVar17;
  int i;
  long lVar18;
  Data *pDVar19;
  ulong uVar20;
  ConstIterator tmp;
  stringstream _iex_throw_s;
  ostream local_1a8 [376];
  
  __lhs = Header::type_abi_cxx11_(header);
  bVar3 = std::operator!=(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )DEEPSCANLINE_abi_cxx11_);
  if (bVar3) {
    pAVar17 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc
              (pAVar17,"Can\'t build a DeepScanLineInputFile from a type-mismatched part.");
    __cxa_throw(pAVar17,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  piVar7 = Header::version(header);
  if (*piVar7 == 1) {
    Header::operator=(&this->_data->header,header);
    pLVar8 = Header::lineOrder(&this->_data->header);
    pDVar19 = this->_data;
    pDVar19->lineOrder = *pLVar8;
    pBVar9 = Header::dataWindow(&pDVar19->header);
    iVar4 = (pBVar9->min).x;
    pDVar19 = this->_data;
    pDVar19->minX = iVar4;
    iVar6 = (pBVar9->max).x;
    pDVar19->maxX = iVar6;
    iVar1 = (pBVar9->min).y;
    pDVar19->minY = iVar1;
    iVar2 = (pBVar9->max).y;
    pDVar19->maxY = iVar2;
    Array2D<unsigned_int>::resizeErase
              (&pDVar19->sampleCount,(long)((iVar2 - iVar1) + 1),(long)((iVar6 - iVar4) + 1));
    pDVar19 = this->_data;
    Array<unsigned_int>::resizeErase
              (&pDVar19->lineSampleCount,(long)((pDVar19->maxY - pDVar19->minY) + 1));
    pCVar10 = Header::compression(&this->_data->header);
    pCVar11 = newCompressor(*pCVar10,0,&this->_data->header);
    iVar4 = numLinesInBuffer(pCVar11);
    pDVar19 = this->_data;
    pDVar19->linesInBuffer = iVar4;
    if (pCVar11 != (Compressor *)0x0) {
      (*pCVar11->_vptr_Compressor[1])(pCVar11);
      pDVar19 = this->_data;
      iVar4 = pDVar19->linesInBuffer;
    }
    pDVar19->nextLineBufferMinY = pDVar19->minY + -1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&pDVar19->lineOffsets,(long)((((pBVar9->max).y - (pBVar9->min).y) + iVar4) / iVar4));
    for (uVar20 = 0; pDVar19 = this->_data,
        uVar20 < (ulong)((long)(pDVar19->lineBuffers).
                               super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pDVar19->lineBuffers).
                               super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); uVar20 = uVar20 + 1)
    {
      pLVar12 = (LineBuffer *)operator_new(0x88);
      pLVar12->minY = 0;
      pLVar12->maxY = 0;
      (pLVar12->buffer)._size = 0;
      (pLVar12->buffer)._data = (char *)0x0;
      pLVar12->dataPtr = (char *)0x0;
      FVar5 = defaultFormat((Compressor *)0x0);
      pLVar12->scanLineMin = FVar5;
      pLVar12->scanLineMax = -1;
      *(undefined1 *)&pLVar12->compressor = 0;
      *(size_type **)&pLVar12->partiallyFull = &(pLVar12->exception)._M_string_length;
      (pLVar12->exception)._M_dataplus._M_p = (pointer)0x0;
      *(undefined1 *)&(pLVar12->exception)._M_string_length = 0;
      IlmThread_2_5::Semaphore::Semaphore
                ((Semaphore *)((pLVar12->exception).field_2._M_local_buf + 8),1);
      (this->_data->lineBuffers).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar20] = pLVar12;
    }
    Array<bool>::resizeErase(&pDVar19->gotSampleCount,(long)((pDVar19->maxY - pDVar19->minY) + 1));
    pDVar19 = this->_data;
    lVar13 = (long)pDVar19->maxY - (long)pDVar19->minY;
    for (lVar18 = 0; lVar18 <= lVar13; lVar18 = lVar18 + 1) {
      (pDVar19->gotSampleCount)._data[lVar18] = false;
    }
    iVar6 = (int)lVar13 + 1;
    iVar4 = pDVar19->linesInBuffer;
    if (iVar6 < pDVar19->linesInBuffer) {
      iVar4 = iVar6;
    }
    iVar4 = ((pDVar19->maxX - pDVar19->minX) + 1) * iVar4 * 4;
    pDVar19->maxSampleCountTableSize = iVar4;
    Array<char>::resizeErase(&pDVar19->sampleCountTableBuffer,(long)iVar4);
    pCVar10 = Header::compression(&this->_data->header);
    pCVar11 = newCompressor(*pCVar10,(long)this->_data->maxSampleCountTableSize,&this->_data->header
                           );
    pDVar19 = this->_data;
    pDVar19->sampleCountTableComp = pCVar11;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&pDVar19->bytesPerLine,(long)((pDVar19->maxY - pDVar19->minY) + 1));
    this_00 = Header::channels(header);
    this->_data->combinedSampleSize = 0;
    cVar14._M_node = (_Base_ptr)ChannelList::begin(this_00);
    while( true ) {
      CVar15 = ChannelList::end(this_00);
      if ((const_iterator)cVar14._M_node == CVar15._i._M_node) {
        return;
      }
      if (2 < (ulong)cVar14._M_node[9]._M_color) break;
      piVar7 = &this->_data->combinedSampleSize;
      *piVar7 = *piVar7 + *(int *)(&DAT_02f3c6d8 + (ulong)cVar14._M_node[9]._M_color * 4);
      cVar14._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar14._M_node);
    }
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    poVar16 = std::operator<<(local_1a8,"Bad type for channel ");
    poVar16 = std::operator<<(poVar16,(char *)(cVar14._M_node + 1));
    std::operator<<(poVar16," initializing deepscanline reader");
    pAVar17 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar17,(stringstream *)&_iex_throw_s);
    __cxa_throw(pAVar17,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar16 = std::operator<<(local_1a8,"Version ");
  piVar7 = Header::version(header);
  poVar16 = (ostream *)std::ostream::operator<<(poVar16,*piVar7);
  std::operator<<(poVar16," not supported for deepscanline images in this version of the library");
  pAVar17 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(pAVar17,(stringstream *)&_iex_throw_s);
  __cxa_throw(pAVar17,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void DeepScanLineInputFile::initialize(const Header& header)
{
    try
    {
        if (header.type() != DEEPSCANLINE)
            throw IEX_NAMESPACE::ArgExc("Can't build a DeepScanLineInputFile from "
            "a type-mismatched part.");
        
        if(header.version()!=1)
        {
            THROW(IEX_NAMESPACE::ArgExc, "Version " << header.version() << " not supported for deepscanline images in this version of the library");
        }
        
        _data->header = header;

        _data->lineOrder = _data->header.lineOrder();

        const Box2i &dataWindow = _data->header.dataWindow();

        _data->minX = dataWindow.min.x;
        _data->maxX = dataWindow.max.x;
        _data->minY = dataWindow.min.y;
        _data->maxY = dataWindow.max.y;

        _data->sampleCount.resizeErase(_data->maxY - _data->minY + 1,
                                       _data->maxX - _data->minX + 1);
        _data->lineSampleCount.resizeErase(_data->maxY - _data->minY + 1);

        Compressor* compressor = newCompressor(_data->header.compression(),
                                               0,
                                               _data->header);

        _data->linesInBuffer = numLinesInBuffer (compressor);

        delete compressor;

        _data->nextLineBufferMinY = _data->minY - 1;

        int lineOffsetSize = (dataWindow.max.y - dataWindow.min.y +
                              _data->linesInBuffer) / _data->linesInBuffer;

        _data->lineOffsets.resize (lineOffsetSize);

        for (size_t i = 0; i < _data->lineBuffers.size(); i++)
            _data->lineBuffers[i] = new LineBuffer ();

        _data->gotSampleCount.resizeErase(_data->maxY - _data->minY + 1);
        for (int i = 0; i < _data->maxY - _data->minY + 1; i++)
            _data->gotSampleCount[i] = false;

        _data->maxSampleCountTableSize = min(_data->linesInBuffer, _data->maxY - _data->minY + 1) *
                                        (_data->maxX - _data->minX + 1) *
                                        sizeof(unsigned int);

        _data->sampleCountTableBuffer.resizeErase(_data->maxSampleCountTableSize);

        _data->sampleCountTableComp = newCompressor(_data->header.compression(),
                                                    _data->maxSampleCountTableSize,
                                                    _data->header);

        _data->bytesPerLine.resize (_data->maxY - _data->minY + 1);
        
        const ChannelList & c=header.channels();
        
        _data->combinedSampleSize=0;
        for(ChannelList::ConstIterator i=c.begin();i!=c.end();i++)
        {
            switch(i.channel().type)
            {
                case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF  :
                    _data->combinedSampleSize+=Xdr::size<half>();
                    break;
                case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT :
                    _data->combinedSampleSize+=Xdr::size<float>();
                    break;
                case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT  :
                    _data->combinedSampleSize+=Xdr::size<unsigned int>();
                    break;
                default :
                    THROW(IEX_NAMESPACE::ArgExc, "Bad type for channel " << i.name() << " initializing deepscanline reader");
                    
            }
        }
        
    }
    catch (...)
    {
        // Don't delete _data here, leave that to caller
        throw;
    }
}